

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

size_t __thiscall QPDF::getObjectCount(QPDF *this)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  unsigned_long uVar2;
  int local_14;
  
  fixDanglingReferences(this,false);
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(size_t *)((long)&(_Var1._M_head_impl)->obj_cache + 0x28) != 0) {
    std::_Rb_tree_decrement((_Rb_tree_node_base *)((long)&(_Var1._M_head_impl)->obj_cache + 8));
  }
  uVar2 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&local_14);
  return uVar2;
}

Assistant:

size_t
QPDF::getObjectCount()
{
    // This method returns the next available indirect object number. makeIndirectObject uses it for
    // this purpose. After fixDanglingReferences is called, all objects in the xref table will also
    // be in obj_cache.
    fixDanglingReferences();
    QPDFObjGen og;
    if (!m->obj_cache.empty()) {
        og = (*(m->obj_cache.rbegin())).first;
    }
    return toS(og.getObj());
}